

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O2

bool __thiscall features::Surf::keypoint_localization(Surf *this,Keypoint *kp)

{
  double *__return_storage_ptr__;
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  element_type *peVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  Matrix<double,_3,_3> *pMVar13;
  long lVar14;
  long lVar15;
  byte bVar16;
  float fVar17;
  float fVar18;
  double dVar19;
  undefined1 local_e8 [8];
  Matrix3d mat_a;
  Vec3d vec_x;
  undefined1 local_58 [8];
  Vec3d vec_b;
  double local_38;
  double det_a;
  
  bVar16 = 0;
  lVar9 = *(long *)&(this->octaves).
                    super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>
                    ._M_impl.super__Vector_impl_data._M_start[kp->octave].imgs.
                    super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                    ._M_impl;
  lVar10 = (long)(int)kp->sample * 0x10;
  lVar12 = *(long *)(lVar9 + -0x10 + lVar10);
  lVar4 = *(long *)(lVar9 + lVar10);
  uVar7 = (ulong)*(int *)(lVar4 + 8);
  lVar8 = *(long *)(lVar12 + 0x18);
  lVar15 = 0;
  if (lVar8 == *(long *)(lVar12 + 0x20)) {
    lVar8 = lVar15;
  }
  lVar14 = (long)((int)kp->y * *(int *)(lVar4 + 8) + (int)kp->x);
  lVar12 = *(long *)(lVar4 + 0x18);
  if (*(long *)(lVar4 + 0x18) == *(long *)(lVar4 + 0x20)) {
    lVar12 = lVar15;
  }
  pfVar1 = (float *)(lVar8 + lVar14 * 4);
  pfVar2 = (float *)(lVar12 + lVar14 * 4);
  lVar9 = *(long *)(lVar9 + 0x10 + lVar10);
  lVar12 = *(long *)(lVar9 + 0x18);
  if (lVar12 == *(long *)(lVar9 + 0x20)) {
    lVar12 = lVar15;
  }
  pfVar3 = (float *)(lVar12 + lVar14 * 4);
  det_a = (double)*pfVar2;
  local_58 = (undefined1  [8])((double)-(pfVar2[1] - pfVar2[-1]) * 0.5);
  vec_b.v[0] = (double)-(pfVar2[uVar7] - pfVar2[-uVar7]) * 0.5;
  vec_b.v[1] = (double)-(*pfVar3 - *pfVar1) * 0.5;
  dVar19 = det_a * -2.0;
  local_e8 = (undefined1  [8])((double)pfVar2[1] + (double)pfVar2[-1] + dVar19);
  mat_a.m[0] = (double)(((pfVar2[uVar7 + 1] - pfVar2[uVar7 - 1]) - pfVar2[1 - uVar7]) +
                       pfVar2[~uVar7]) * 0.25;
  mat_a.m[1] = (double)(((pfVar3[1] - pfVar3[-1]) - pfVar1[1]) + pfVar1[-1]) * 0.25;
  mat_a.m[3] = (double)pfVar2[uVar7] + (double)pfVar2[-uVar7] + dVar19;
  mat_a.m[4] = (double)(((pfVar3[uVar7] - pfVar3[-uVar7]) - pfVar1[uVar7]) + pfVar1[-uVar7]) * 0.25;
  mat_a.m[7] = (double)*pfVar3 + (double)*pfVar1 + dVar19;
  mat_a.m[2] = mat_a.m[0];
  mat_a.m[5] = mat_a.m[1];
  mat_a.m[6] = mat_a.m[4];
  local_38 = math::matrix_determinant<double>((Matrix<double,_3,_3> *)local_e8);
  if (ABS(local_38) <= 9.999999747378752e-06) goto LAB_001376bb;
  __return_storage_ptr__ = mat_a.m + 8;
  math::matrix_inverse<double>
            ((Matrix<double,_3,_3> *)__return_storage_ptr__,(Matrix<double,_3,_3> *)local_e8,
             &local_38);
  pdVar11 = __return_storage_ptr__;
  pMVar13 = (Matrix<double,_3,_3> *)local_e8;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    pMVar13->m[0] = *pdVar11;
    pdVar11 = pdVar11 + (ulong)bVar16 * -2 + 1;
    pMVar13 = (Matrix<double,_3,_3> *)((long)pMVar13 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  math::Matrix<double,_3,_3>::mult
            ((Vector<double,_3> *)__return_storage_ptr__,(Matrix<double,_3,_3> *)local_e8,
             (Vector<double,_3> *)local_58);
  dVar19 = math::Vector<double,_3>::maximum((Vector<double,_3> *)__return_storage_ptr__);
  if (dVar19 <= 0.5) {
    dVar19 = math::Vector<double,_3>::minimum((Vector<double,_3> *)(mat_a.m + 8));
    if (-0.5 <= dVar19) {
      dVar19 = math::Vector<double,_3>::dot
                         ((Vector<double,_3> *)local_58,(Vector<double,_3> *)(mat_a.m + 8));
      if ((this->options).contrast_threshold <= (float)(dVar19 * -0.5 + det_a)) {
        vec_b.v[2]._4_4_ = 2;
        iVar6 = math::fastpow<int>((int *)((long)vec_b.v + 0x14),kp->octave);
        fVar18 = (float)(((double)kp->x + mat_a.m[8]) * (double)iVar6);
        kp->x = fVar18;
        fVar17 = (float)(((double)kp->y + vec_x.v[0]) * (double)iVar6);
        kp->y = fVar17;
        kp->sample = (float)((double)kp->sample + vec_x.v[1]);
        if (0.0 <= fVar18) {
          peVar5 = (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          lVar15 = 0;
          if (((float)(peVar5->super_TypedImageBase<long>).super_ImageBase.w < fVar18 + 1.0) ||
             (fVar17 < 0.0)) goto LAB_001376bb;
          if (fVar17 + 1.0 <= (float)(peVar5->super_TypedImageBase<long>).super_ImageBase.h) {
            lVar15 = 1;
            goto LAB_001376bb;
          }
        }
      }
    }
  }
  lVar15 = 0;
LAB_001376bb:
  return SUB81(lVar15,0);
}

Assistant:

bool
Surf::keypoint_localization (Keypoint* kp)
{
    int const sample = static_cast<int>(kp->sample);
    int const w = this->octaves[kp->octave].imgs[sample]->width();
    //int const h = this->octaves[kp->octave].imgs[sample]->height();
    int off = static_cast<int>(kp->x) + static_cast<int>(kp->y) * w;
    Octave::RespType const *s0, *s1, *s2;
    s0 = this->octaves[kp->octave].imgs[sample - 1]->get_data_pointer() + off;
    s1 = this->octaves[kp->octave].imgs[sample]->get_data_pointer() + off;
    s2 = this->octaves[kp->octave].imgs[sample + 1]->get_data_pointer() + off;

    float N9[3][9] =
    {
        { s0[-1-w], s0[-w], s0[1-w], s0[-1], s0[0], s0[1], s0[w-1], s0[w], s0[1+w] },
        { s1[-1-w], s1[-w], s1[1-w], s1[-1], s1[0], s1[1], s1[w-1], s1[w], s1[1+w] },
        { s2[-1-w], s2[-w], s2[1-w], s2[-1], s2[0], s2[1], s2[w-1], s2[w], s2[1+w] }
    };

    /* Switch to processing in double. Determinant can be very large. */
    math::Vec3d vec_b;
    math::Matrix3d mat_a;
    vec_b[0] = -(N9[1][5] - N9[1][3]) * 0.5;  // 1st deriv x.
    vec_b[1] = -(N9[1][7] - N9[1][1]) * 0.5;  // 1st deriv y.
    vec_b[2] = -(N9[2][4] - N9[0][4]) * 0.5;  // 1st deriv s.

    mat_a[0] = N9[1][3] - 2.0 * N9[1][4] + N9[1][5];                 // xx
    mat_a[1] = (N9[1][8] - N9[1][6] - N9[1][2] + N9[1][0]) * 0.25;   // xy
    mat_a[2] = (N9[2][5] - N9[2][3] - N9[0][5] + N9[0][3]) * 0.25;   // xs
    mat_a[3] = mat_a[1];                                             // yx
    mat_a[4] = N9[1][1] - 2.0 * N9[1][4] + N9[1][7];                 // yy
    mat_a[5] = (N9[2][7] - N9[2][1] - N9[0][7] + N9[0][1]) * 0.25;   // ys
    mat_a[6] = mat_a[2];                                             // sx
    mat_a[7] = mat_a[5];                                             // sy
    mat_a[8] = N9[0][4] - 2.0 * N9[1][4] + N9[2][4];                 // ss

    /* Compute determinant to detect singular matrix. */
    double det_a = math::matrix_determinant(mat_a);
    //std::cout << "Determinant: " << det_a << std::endl;
    if (MATH_EPSILON_EQ(det_a, 0.0f, 1.0e-5f))
    {
        //std::cout << "Rejection keypoint: det = " << det_a << std::endl;
        return false;
    }

    /* Invert the matrix to get the accurate keypoint. */
    mat_a = math::matrix_inverse(mat_a, det_a);
    math::Vec3d vec_x = mat_a * vec_b;

    /* Reject keypoint if location is too far off original point. */
    if (vec_x.maximum() > 0.5 || vec_x.minimum() < -0.5f)
        return false;

    /* Compute actual DoG value at accurate keypoint x. */
    float dog_value = N9[1][4] - 0.5 * vec_b.dot(vec_x);
    if (dog_value < this->options.contrast_threshold)
    {
        //std::cout << "Rejection keypoint: Contrast Thres" << std::endl;
        return false;
    }

    /* Update keypoint. */
    float sampling = static_cast<float>(math::fastpow(2, kp->octave));
    kp->x = (kp->x + vec_x[0]) * sampling;
    kp->y = (kp->y + vec_x[1]) * sampling;
    // OpenSURF code: ipt.scale = static_cast<float>((0.1333f) * (m->filter + xi * filterStep));
    kp->sample += vec_x[2]; // Is this correct? No! FIXME!

    if (kp->x < 0.0f || kp->x + 1.0f > this->sat->width()
        || kp->y < 0.0f || kp->y + 1.0f > this->sat->height())
    {
        //std::cout << "SURF: Rejection keypoint: OOB "
        //    << kp->x << " " << kp->y  << " / " << vec_x[0] << " "
        //    << vec_x[1] << std::endl;
        return false;
    }

    return true;
}